

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

Info * __thiscall
re2::Regexp::Walker<re2::Prefilter::Info_*>::WalkInternal
          (Walker<re2::Prefilter::Info_*> *this,Regexp *re,Info *top_arg,bool use_copy)

{
  ushort uVar1;
  uint uVar2;
  deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
  *pdVar3;
  undefined8 *puVar4;
  stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
  *psVar5;
  Regexp *pRVar6;
  _Map_pointer ppWVar7;
  WalkState<re2::Prefilter::Info_*> *pWVar8;
  char cVar9;
  Info *pIVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar13;
  Info *pIVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Info **ppIVar15;
  WalkState<re2::Prefilter::Info_*> *pWVar16;
  _Elt_pointer pWVar17;
  Info *unaff_R13;
  bool stop;
  Info *local_1b8;
  undefined1 local_1b0 [24];
  Info *pIStack_198;
  Info *local_190;
  Info **ppIStack_188;
  undefined4 extraout_var_00;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  else {
    pdVar3 = (deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
              *)this->stack_;
    local_1b0._8_4_ = -1;
    ppIStack_188 = (Info **)0x0;
    puVar4 = *(undefined8 **)(pdVar3 + 0x30);
    local_1b0._0_8_ = re;
    local_1b0._16_8_ = top_arg;
    if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x30)) {
      std::
      deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
      ::_M_push_back_aux<re2::WalkState<re2::Prefilter::Info*>>
                (pdVar3,(WalkState<re2::Prefilter::Info_*> *)local_1b0);
    }
    else {
      puVar4[4] = local_190;
      puVar4[5] = 0;
      puVar4[2] = top_arg;
      puVar4[3] = pIStack_198;
      *puVar4 = re;
      puVar4[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
      *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x30;
    }
    do {
      psVar5 = this->stack_;
      pWVar17 = (psVar5->c).
                super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar17 ==
          (psVar5->c).
          super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar17 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar6 = pWVar17[-1].re;
      pIVar14 = unaff_R13;
      if (pWVar17[-1].n == -1) {
        iVar12 = this->max_visits_;
        this->max_visits_ = iVar12 + -1;
        if (iVar12 < 1) {
          this->stopped_early_ = true;
          iVar12 = (*this->_vptr_Walker[5])(this,pRVar6,pWVar17[-1].parent_arg);
          pIVar14 = (Info *)CONCAT44(extraout_var_00,iVar12);
        }
        else {
          local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
          iVar12 = (*this->_vptr_Walker[2])(this,pRVar6,pWVar17[-1].parent_arg);
          pWVar17[-1].pre_arg = (Info *)CONCAT44(extraout_var,iVar12);
          cVar9 = local_1b0[0];
          pIVar14 = (Info *)CONCAT44(extraout_var,iVar12);
          if (local_1b0[0] == '\0') {
            pWVar17[-1].n = 0;
            pWVar17[-1].child_args = (Info **)0x0;
            uVar1 = pRVar6->nsub_;
            pIVar14 = unaff_R13;
            if (uVar1 != 0) {
              if (uVar1 == 1) {
                ppIVar15 = &pWVar17[-1].child_arg;
              }
              else {
                ppIVar15 = (Info **)operator_new__((ulong)uVar1 << 3);
              }
              pWVar17[-1].child_args = ppIVar15;
            }
          }
          if (cVar9 == '\0') goto LAB_0011ef79;
        }
LAB_0011f138:
        std::
        deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
        ::pop_back(&this->stack_->c);
        psVar5 = this->stack_;
        ppWVar7 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        pWVar16 = (psVar5->c).
                  super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pWVar8 = (psVar5->c).
                 super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        iVar12 = 1;
        pIVar10 = pIVar14;
        if (((long)pWVar16 - (long)pWVar8 >> 4) * -0x5555555555555555 +
            (((long)ppWVar7 -
              (long)(psVar5->c).
                    super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppWVar7 == (_Map_pointer)0x0)) * 10 !=
            ((long)(psVar5->c).
                   super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(psVar5->c).
                   super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555) {
          if (pWVar16 == pWVar8) {
            pWVar16 = ppWVar7[-1] + 10;
          }
          if (pWVar16[-1].child_args == (Info **)0x0) {
            ppIVar15 = &pWVar16[-1].child_arg;
          }
          else {
            ppIVar15 = pWVar16[-1].child_args + pWVar16[-1].n;
          }
          *ppIVar15 = pIVar14;
          pWVar16[-1].n = pWVar16[-1].n + 1;
          iVar12 = 0;
          pIVar10 = local_1b8;
        }
      }
      else {
LAB_0011ef79:
        uVar1 = pRVar6->nsub_;
        if (uVar1 == 0) {
LAB_0011f0e7:
          iVar12 = (*this->_vptr_Walker[3])
                             (this,pRVar6,pWVar17[-1].parent_arg,pWVar17[-1].pre_arg,
                              pWVar17[-1].child_args,(ulong)(uint)pWVar17[-1].n);
          pIVar14 = (Info *)CONCAT44(extraout_var_02,iVar12);
          if ((1 < pRVar6->nsub_) && (pWVar17[-1].child_args != (Info **)0x0)) {
            operator_delete__(pWVar17[-1].child_args);
          }
          goto LAB_0011f138;
        }
        if (uVar1 == 1) {
          paVar13 = &pRVar6->field_5;
        }
        else {
          paVar13 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar6->field_5).submany_;
        }
        uVar2 = pWVar17[-1].n;
        iVar12 = 0;
        if ((int)uVar2 < (int)(uint)uVar1) {
          if (((int)uVar2 < 1 || !use_copy) ||
             ((Regexp *)paVar13[uVar2 - 1].submany_ != (Regexp *)paVar13[uVar2].submany_)) {
            pdVar3 = (deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
                      *)this->stack_;
            local_1b0._0_8_ = paVar13[pWVar17[-1].n].submany_;
            local_1b0._16_8_ = pWVar17[-1].pre_arg;
            local_1b0._8_4_ = -1;
            ppIStack_188 = (Info **)0x0;
            puVar4 = *(undefined8 **)(pdVar3 + 0x30);
            if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x30)) {
              std::
              deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
              ::_M_push_back_aux<re2::WalkState<re2::Prefilter::Info*>>
                        (pdVar3,(WalkState<re2::Prefilter::Info_*> *)local_1b0);
            }
            else {
              puVar4[4] = local_190;
              puVar4[5] = 0;
              puVar4[2] = local_1b0._16_8_;
              puVar4[3] = pIStack_198;
              *puVar4 = local_1b0._0_8_;
              puVar4[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
              *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x30;
            }
          }
          else {
            iVar11 = (*this->_vptr_Walker[4])(this,pWVar17[-1].child_args[uVar2 - 1]);
            iVar12 = pWVar17[-1].n;
            pWVar17[-1].child_args[iVar12] = (Info *)CONCAT44(extraout_var_01,iVar11);
            pWVar17[-1].n = iVar12 + 1;
          }
          iVar12 = 3;
        }
        pIVar10 = local_1b8;
        if ((int)(uint)uVar1 <= (int)uVar2) goto LAB_0011f0e7;
      }
      local_1b8 = pIVar10;
      unaff_R13 = pIVar14;
    } while ((iVar12 == 0) || (top_arg = local_1b8, iVar12 == 3));
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}